

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O3

shared_ptr<Assimp::FIHexValue> __thiscall
Assimp::FIHexValue::create
          (FIHexValue *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *value)

{
  pointer puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  pointer puVar2;
  shared_ptr<Assimp::FIHexValue> sVar3;
  
  puVar2 = (pointer)operator_new(0x58);
  puVar2[8] = '\x01';
  puVar2[9] = '\0';
  puVar2[10] = '\0';
  puVar2[0xb] = '\0';
  puVar2[0xc] = '\x01';
  puVar2[0xd] = '\0';
  puVar2[0xe] = '\0';
  puVar2[0xf] = '\0';
  *(undefined ***)puVar2 = &PTR___Sp_counted_ptr_inplace_009387c8;
  *(undefined ***)(puVar2 + 0x10) = &PTR_toString_abi_cxx11__00938818;
  *(pointer *)(puVar2 + 0x30) = puVar2 + 0x40;
  puVar2[0x38] = '\0';
  puVar2[0x39] = '\0';
  puVar2[0x3a] = '\0';
  puVar2[0x3b] = '\0';
  puVar2[0x3c] = '\0';
  puVar2[0x3d] = '\0';
  puVar2[0x3e] = '\0';
  puVar2[0x3f] = '\0';
  puVar2[0x40] = '\0';
  puVar2[0x50] = '\0';
  puVar1 = (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  *(pointer *)(puVar2 + 0x18) =
       (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)(puVar2 + 0x20) = puVar1;
  *(pointer *)(puVar2 + 0x28) =
       (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_FIByteValue).super_FIValue._vptr_FIValue = (_func_int **)(puVar2 + 0x10);
  (this->super_FIByteValue).value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = puVar2;
  sVar3.super___shared_ptr<Assimp::FIHexValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  sVar3.super___shared_ptr<Assimp::FIHexValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<Assimp::FIHexValue>)
         sVar3.super___shared_ptr<Assimp::FIHexValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<FIHexValue> FIHexValue::create(std::vector<uint8_t> &&value) {
    return std::make_shared<FIHexValueImpl>(std::move(value));
}